

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void xprint_paren(Parser *pp,PNode *p)

{
  PNode *pPVar1;
  uint32 uVar2;
  PNode *_t;
  char *c;
  uint i;
  PNode *p_local;
  Parser *pp_local;
  
  while (p->latest != p->latest->latest) {
    pPVar1 = p->latest->latest;
    pPVar1->refcount = pPVar1->refcount + 1;
    uVar2 = p->latest->refcount - 1;
    p->latest->refcount = uVar2;
    if (uVar2 == 0) {
      free_PNode(pp,p->latest);
    }
    p->latest = pPVar1;
  }
  pPVar1 = p->latest;
  if (pPVar1->error_recovery == '\0') {
    printf("[%p %s]",pPVar1,pp->t->symbols[(pPVar1->parse_node).symbol].name);
    if ((pPVar1->children).n == 0) {
      if ((pPVar1->parse_node).start_loc.s != (pPVar1->parse_node).end_skip) {
        printf(" ");
        for (_t = (PNode *)(pPVar1->parse_node).start_loc.s;
            _t < (PNode *)(pPVar1->parse_node).end_skip; _t = (PNode *)((long)&_t->hash + 1)) {
          printf("%c",(ulong)(uint)(int)(char)_t->hash);
        }
        printf(" ");
      }
    }
    else {
      printf("(");
      for (c._4_4_ = 0; c._4_4_ < (pPVar1->children).n; c._4_4_ = c._4_4_ + 1) {
        xprint_paren(pp,(pPVar1->children).v[c._4_4_]);
      }
      printf(")");
    }
    if (pPVar1->ambiguities != (PNode *)0x0) {
      printf(" |OR| ");
      xprint_paren(pp,pPVar1->ambiguities);
    }
  }
  return;
}

Assistant:

void xprint_paren(Parser *pp, PNode *p) {
  uint i;
  char *c;
  LATEST(pp, p);
  if (!p->error_recovery) {
    printf("[%p %s]", (void *)p, pp->t->symbols[p->parse_node.symbol].name);
    if (p->children.n) {
      printf("(");
      for (i = 0; i < p->children.n; i++) xprint_paren(pp, p->children.v[i]);
      printf(")");
    } else if (p->parse_node.start_loc.s != p->parse_node.end_skip) {
      printf(" ");
      for (c = p->parse_node.start_loc.s; c < p->parse_node.end_skip; c++) printf("%c", *c);
      printf(" ");
    }
    if (p->ambiguities) {
      printf(" |OR| ");
      xprint_paren(pp, p->ambiguities);
    }
  }
}